

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

void __thiscall
lest::message::message(message *this,text *kind_,location *where_,text *expr_,text *note_)

{
  string asStack_48 [32];
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)expr_);
  *(undefined ***)this = &PTR__message_00147710;
  std::__cxx11::string::string((string *)&this->kind,(string *)kind_);
  location::location(&this->where,where_);
  std::__cxx11::string::string(asStack_48,(string *)note_);
  std::__cxx11::string::string((string *)&this->note,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  return;
}

Assistant:

message( text kind_, location where_, text expr_, text note_ = "" )
    : std::runtime_error( expr_), kind( kind_), where( where_), note( note_) {}